

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_py_struct_required_validator
          (t_py_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  ostream *poVar3;
  pointer pptVar4;
  string *psVar5;
  pointer pptVar6;
  string local_50 [32];
  
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,"def validate(self):");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar4 != pptVar6) {
    for (; pptVar6 != pptVar4; pptVar6 = pptVar6 + 1) {
      ptVar2 = *pptVar6;
      if (ptVar2->req_ == T_REQUIRED) {
        poVar3 = t_generator::indent(&this->super_t_generator,out);
        poVar3 = std::operator<<(poVar3,"if self.");
        psVar5 = &ptVar2->name_;
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        poVar3 = std::operator<<(poVar3," is None:");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        poVar3 = t_generator::indent(&this->super_t_generator,out);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_50,this);
        poVar3 = std::operator<<(poVar3,local_50);
        poVar3 = std::operator<<(poVar3,"raise TProtocolException(message=\'Required field ");
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        poVar3 = std::operator<<(poVar3," is unset!\')");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string(local_50);
        pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,"return");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void t_py_generator::generate_py_struct_required_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "def validate(self):" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();

  if (fields.size() > 0) {
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* field = (*f_iter);
      if (field->get_req() == t_field::T_REQUIRED) {
        indent(out) << "if self." << field->get_name() << " is None:" << endl;
        indent(out) << indent_str() << "raise TProtocolException(message='Required field "
                    << field->get_name() << " is unset!')" << endl;
      }
    }
  }

  indent(out) << "return" << endl;
  indent_down();
}